

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderError1InputBlocks::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError1InputBlocks *this,
          uint n_program_object)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${SHADER_IO_BLOCKS_REQUIRE}\n\nout IN_TC\n{\n    vec4 test_block_field;\n} test_block;\n\nvoid main()\n{\n    test_block.test_block_field = vec4(1.0, 2.0, 3.0, gl_VertexID);\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError1InputBlocks::getVertexShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${SHADER_IO_BLOCKS_REQUIRE}\n"
		   "\n"
		   "out IN_TC\n"
		   "{\n"
		   "    vec4 test_block_field;\n"
		   "} test_block;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    test_block.test_block_field = vec4(1.0, 2.0, 3.0, gl_VertexID);\n"
		   "}\n";
}